

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.hpp
# Opt level: O0

void diy::mpi::Collectives<char,_void_*>::gather
               (communicator *comm,vector<char,_std::allocator<char>_> *in,
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *out,int root)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  datatype *type;
  const_iterator __position;
  vector<char,_std::allocator<char>_> *this;
  vector<char,_std::allocator<char>_> *this_00;
  char *pcVar5;
  int in_ECX;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  communicator *in_RDI;
  size_t count;
  size_t i;
  size_t offset;
  vector<char,_std::allocator<char>_> buffer;
  int elem_size;
  vector<int,_std::allocator<int>_> offsets;
  vector<int,_std::allocator<int>_> counts;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe88;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffe98;
  communicator *in_stack_fffffffffffffea0;
  char *__last;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *__first;
  undefined4 in_stack_fffffffffffffec8;
  communicator *pcVar6;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  communicator *in_stack_fffffffffffffef0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff00;
  int root_00;
  char *local_c8;
  vector<char,_std::allocator<char>_> local_b0;
  int local_94;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  int *local_68;
  communicator local_60;
  int local_48;
  vector<int,_std::allocator<int>_> local_38;
  int local_1c;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_18;
  vector<char,_std::allocator<char>_> *local_10;
  communicator *local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1773b3);
  iVar1 = communicator::rank(local_8);
  if (iVar1 == local_1c) {
    communicator::size(local_8);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
               (size_type)in_stack_fffffffffffffe88._M_current);
  }
  pcVar6 = local_8;
  local_48 = count<std::vector<char,std::allocator<char>>>
                       ((vector<char,_std::allocator<char>_> *)0x177420);
  root_00 = (int)pcVar6;
  Collectives<int,_void_*>::gather
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
             (int)((ulong)in_stack_fffffffffffffe88._M_current >> 0x20));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17746a);
  iVar1 = communicator::rank(local_8);
  if (iVar1 == local_1c) {
    std::vector<int,_std::allocator<int>_>::size(&local_38);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
               (size_type)in_stack_fffffffffffffe88._M_current);
    in_stack_fffffffffffffef0 = &local_60;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,0);
    *pvVar4 = 0;
    in_stack_fffffffffffffee8 = &local_38;
    local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    local_78 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    local_70 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator-(in_stack_fffffffffffffe78._M_current,
                                CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    local_88 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68);
    local_80 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator+(in_stack_fffffffffffffe78._M_current,
                                CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    in_stack_ffffffffffffff00 =
         std::
         partial_sum<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                   (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_90 = in_stack_ffffffffffffff00._M_current;
  }
  std::vector<char,_std::allocator<char>_>::operator[](local_10,0);
  iVar1 = count<char>((char *)0x1775b3);
  local_94 = iVar1;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1775d1);
  iVar2 = communicator::rank(local_8);
  if (iVar2 == local_1c) {
    std::vector<int,_std::allocator<int>_>::back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    std::vector<int,_std::allocator<int>_>::back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88._M_current);
  }
  pcVar6 = local_8;
  type = (datatype *)
         address<std::vector<char,std::allocator<char>>>
                   ((vector<char,_std::allocator<char>_> *)0x177670);
  iVar3 = count<std::vector<char,std::allocator<char>>>
                    ((vector<char,_std::allocator<char>_> *)0x177684);
  datatype_of<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffe68);
  __position._M_current =
       (char *)address<std::vector<char,std::allocator<char>>>
                         ((vector<char,_std::allocator<char>_> *)0x1776b8);
  this = (vector<char,_std::allocator<char>_> *)
         std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x1776cc)
  ;
  this_00 = (vector<char,_std::allocator<char>_> *)
            std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x1776de);
  iVar2 = local_1c;
  detail::gather_v(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,iVar1,type,pcVar6,
                   (int *)CONCAT44(iVar3,in_stack_fffffffffffffec8),
                   in_stack_ffffffffffffff00._M_current,root_00);
  iVar1 = communicator::rank(local_8);
  if (iVar1 == local_1c) {
    __first = local_18;
    communicator::size(local_8);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88._M_current);
    local_c8 = (char *)0x0;
    while (__last = local_c8,
          pcVar5 = (char *)std::
                           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           ::size(local_18), __last < pcVar5) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_38,(size_type)local_c8);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](local_18,(size_type)local_c8);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](local_18,(size_type)local_c8);
      std::vector<char,_std::allocator<char>_>::end(this_00);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,iVar2),
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)this_00);
      in_stack_fffffffffffffe80._M_current = (int *)&local_b0;
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x177831);
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x17784b);
      std::vector<char,std::allocator<char>>::insert<char*,void>
                (this,__position,(char *)__first,__last);
      local_c8 = local_c8 + 1;
    }
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe80._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80._M_current);
  return;
}

Assistant:

static void gather(const communicator& comm, const std::vector<T>& in, std::vector< std::vector<T> >& out, int root)
    {
      std::vector<int> counts;
      if (comm.rank() == root)
      {
        counts.resize(static_cast<size_t>(comm.size()));
      }

      Collectives<int,void*>::gather(comm, count(in), counts, root);

      std::vector<int> offsets;
      if (comm.rank() == root)
      {
        offsets.resize(counts.size());
        offsets[0] = 0;
        std::partial_sum(counts.begin(), counts.end() - 1, offsets.begin() + 1);
      }

      int elem_size = count(in[0]);     // size of 1 vector element in units of mpi datatype
      std::vector<T> buffer;
      if (comm.rank() == root)
      {
        buffer.resize((offsets.back() + counts.back()) / elem_size);
      }

      detail::gather_v(comm, address(in), count(in), datatype_of(in),
                       address(buffer), counts.data(), offsets.data(),
                       root);

      if (comm.rank() == root)
      {
          out.resize(static_cast<size_t>(comm.size()));
          size_t offset = 0;
          for (size_t i = 0; i < out.size(); ++i)
          {
            auto count = static_cast<size_t>(counts[i] / elem_size);
            out[i].insert(out[i].end(), buffer.data() + offset, buffer.data() + offset + count);
            offset += count;
          }
      }
    }